

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O3

bool __thiscall QProcessPrivate::startDetached(QProcessPrivate *this,qint64 *pid)

{
  undefined8 uVar1;
  QBasicAtomicInt __fd;
  ArrayOptions __fd_00;
  bool bVar2;
  int __pid;
  int iVar3;
  int iVar4;
  __pid_t _Var5;
  int *piVar6;
  ssize_t sVar7;
  qint64 qVar8;
  long lVar9;
  ssize_t bytesRead;
  anon_class_32_4_344bbdd6 *childLambda;
  EVP_PKEY_CTX *ctx;
  int in_R8D;
  long in_FS_OFFSET;
  QUtf8StringView fnName;
  QUtf8StringView fnName_00;
  pid_t actualPid;
  int result;
  ChildError childStatus;
  QChildProcess childProcess;
  QString local_340;
  undefined4 local_324;
  undefined1 local_320 [16];
  QChildProcess *local_310;
  QProcessPrivate *local_308;
  QChildProcess local_120;
  AutoPipe local_48;
  QArrayData local_40;
  
  local_40.alloc = *(long *)(in_FS_OFFSET + 0x28);
  local_40.ref_._q_value.super___atomic_base<int>._M_i = (Type)0xffffffff;
  local_40.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
  super_QFlagsStorage<QArrayData::ArrayOption>.i =
       (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0xffffffff;
  pipe2((int *)&local_40,0x80000);
  local_48.pipe[0] = -1;
  local_48.pipe[1] = -1;
  pipe2(local_48.pipe,0x80000);
  if (((int)local_40.ref_._q_value.super___atomic_base<int>._M_i < 0) || (local_48.pipe[0] < 0)) {
    fnName.m_size = 0xffffffff;
    fnName.m_data = (storage_type *)0x4;
    anon_unknown.dwarf_14cf1db::errorMessageForSyscall
              ((QString *)local_320,(anon_unknown_dwarf_14cf1db *)0x58157f,fnName,in_R8D);
    setErrorAndEmit(this,FailedToStart,(QString *)local_320);
    if ((QArrayData *)local_320._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_320._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_320._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_320._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_320._0_8_,2,0x10);
      }
    }
  }
  else {
    bVar2 = openChannelsForDetached(this);
    if (bVar2) {
      memset(&local_120,0xaa,0xd8);
      anon_unknown.dwarf_14cf1db::QChildProcess::QChildProcess(&local_120,this);
      if (local_120.workingDirectory == -1) {
LAB_004258c0:
        bVar2 = false;
      }
      else {
        this->childStartedPipe[1] =
             (Q_PIPE)local_40.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                     super_QFlagsStorage<QArrayData::ArrayOption>.i;
        childLambda = (anon_class_32_4_344bbdd6 *)local_320;
        local_320._0_8_ = &local_40;
        local_320._8_8_ = &local_48;
        local_310 = &local_120;
        local_308 = this;
        __pid = (anonymous_namespace)::QChildProcess::
                doFork<QProcessPrivate::startDetached(long_long*)::__0>
                          ((QChildProcess *)(ulong)(uint)local_120._204_4_,childLambda);
        this->childStartedPipe[1] = -1;
        piVar6 = __errno_location();
        iVar4 = *piVar6;
        closeChannels(this);
        if (__pid == -1) {
          anon_unknown.dwarf_14cf1db::QChildProcess::cleanup(&local_120,(EVP_PKEY_CTX *)childLambda)
          ;
          fnName_00.m_size._0_4_ = iVar4;
          fnName_00.m_data = (storage_type *)0x4;
          fnName_00.m_size._4_4_ = 0;
          anon_unknown.dwarf_14cf1db::errorMessageForSyscall
                    ((QString *)local_320,(anon_unknown_dwarf_14cf1db *)"fork",fnName_00,in_R8D);
          setErrorAndEmit(this,FailedToStart,(QString *)local_320);
          uVar1 = local_320._0_8_;
          if ((QArrayData *)local_320._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_320._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_320._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar1)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_320._0_8_,2,0x10);
            }
          }
          goto LAB_004258c0;
        }
        iVar4 = local_48.pipe[1];
        do {
          iVar3 = close(iVar4);
          if (iVar3 != -1) break;
        } while (*piVar6 == 4);
        __fd_00.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
        super_QFlagsStorage<QArrayData::ArrayOption>.i =
             local_40.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
             super_QFlagsStorage<QArrayData::ArrayOption>.i;
        do {
          iVar4 = close((int)__fd_00.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                             super_QFlagsStorage<QArrayData::ArrayOption>.i);
          if (iVar4 != -1) break;
        } while (*piVar6 == 4);
        local_40.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
        super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0xffffffff;
        local_48.pipe[1] = -1;
        memset(local_320,0xaa,0x200);
        __fd._q_value.super___atomic_base<int>._M_i =
             local_40.ref_._q_value.super___atomic_base<int>._M_i;
        do {
          sVar7 = read((int)__fd._q_value.super___atomic_base<int>._M_i,local_320,0x200);
          if (sVar7 != -1) break;
        } while (*piVar6 == 4);
        local_324 = 0xaaaaaaaa;
        do {
          ctx = (EVP_PKEY_CTX *)&local_324;
          _Var5 = waitpid(__pid,(int *)&local_324,0);
          if (_Var5 != -1) break;
        } while (*piVar6 == 4);
        bVar2 = sVar7 == 0;
        if (pid == (qint64 *)0x0 || !bVar2) {
          if (sVar7 != 0) {
            if (pid != (qint64 *)0x0) {
              *pid = -1;
            }
            anon_unknown.dwarf_14cf1db::QChildProcess::cleanup(&local_120,ctx);
            anon_unknown.dwarf_14cf1db::startFailureErrorMessage
                      (&local_340,(ChildError *)local_320,bytesRead);
            setErrorAndEmit(this,FailedToStart,&local_340);
            piVar6 = (int *)CONCAT44(local_340.d.d._4_4_,(int)local_340.d.d);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_340.d.d._4_4_,(int)local_340.d.d),2,0x10);
              }
            }
          }
        }
        else {
          local_340.d.d._0_4_ = -0x55555556;
          qVar8 = qt_safe_read(local_48.pipe[0],&local_340,4);
          lVar9 = 0;
          if (qVar8 == 4) {
            lVar9 = (long)(int)local_340.d.d;
          }
          *pid = lVar9;
        }
      }
      anon_unknown.dwarf_14cf1db::QChildProcess::~QChildProcess(&local_120);
      goto LAB_004258cf;
    }
    closeChannels(this);
  }
  bVar2 = false;
LAB_004258cf:
  anon_unknown.dwarf_14cf1db::AutoPipe::~AutoPipe(&local_48);
  anon_unknown.dwarf_14cf1db::AutoPipe::~AutoPipe((AutoPipe *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_40.alloc) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::startDetached(qint64 *pid)
{
    AutoPipe startedPipe, pidPipe;
    if (!startedPipe || !pidPipe) {
        setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("pipe"));
        return false;
    }

    if (!openChannelsForDetached()) {
        // openChannel sets the error string
        closeChannels();
        return false;
    }

    // see startProcess() for more information
    QChildProcess childProcess(this);
    if (!childProcess.ok()) {
        Q_ASSERT(processError != QProcess::UnknownError);
        return false;
    }

    childStartedPipe[1] = startedPipe[1];   // for failChildProcess()
    pid_t childPid = childProcess.doFork([&] {
        ::setsid();

        qt_safe_close(startedPipe[0]);
        qt_safe_close(pidPipe[0]);

        pid_t doubleForkPid;
        if (childProcess.startChild(&doubleForkPid) == -1)
            failChildProcess(this, "fork", errno);

        // success
        qt_safe_write(pidPipe[1], &doubleForkPid, sizeof(pid_t));
        return 0;
    });
    childStartedPipe[1] = -1;

    int savedErrno = errno;
    closeChannels();

    if (childPid == -1) {
        childProcess.cleanup();
        setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("fork", savedErrno));
        return false;
    }

    // close the writing ends of the pipes so we can properly get EOFs
    qt_safe_close(pidPipe[1]);
    qt_safe_close(startedPipe[1]);
    pidPipe[1] = startedPipe[1] = -1;

    // This read() will block until we're cleared to proceed. If it returns 0
    // (EOF), it means the direct child has exited and the grandchild
    // successfully execve()'d the target process. If it returns any positive
    // result, it means one of the two children wrote an error result. Negative
    // values should not happen.
    ChildError childStatus;
    ssize_t startResult = qt_safe_read(startedPipe[0], &childStatus, sizeof(childStatus));

    // reap the intermediate child
    int result;
    qt_safe_waitpid(childPid, &result, 0);

    bool success = (startResult == 0);  // nothing written -> no error
    if (success && pid) {
        pid_t actualPid;
        if (qt_safe_read(pidPipe[0], &actualPid, sizeof(pid_t)) != sizeof(pid_t))
            actualPid = 0;              // this shouldn't happen!
        *pid = actualPid;
    } else if (!success) {
        if (pid)
            *pid = -1;
        childProcess.cleanup();
        setErrorAndEmit(QProcess::FailedToStart,
                        startFailureErrorMessage(childStatus, startResult));
    }
    return success;
}